

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
RemoveHead<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
           *this,NoThrowHeapAllocator *allocator)

{
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *buffer;
  
  buffer = (this->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.node;
  if (buffer == (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x158,"(!this->Empty())","!this->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    buffer = (this->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
             next.node;
  }
  pDVar1 = (buffer->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.base;
  (((buffer->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
    prev.base)->next).base = pDVar1;
  pDVar1->prev = (buffer->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 ).prev;
  Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>::~SegmentBase
            (&(buffer->data).super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x98);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, (Node *)node);

        this->DecrementCount();
    }